

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void __thiscall
wallet::coinselector_tests::SelectCoins_effective_value_test::test_method
          (SelectCoins_effective_value_test *this)

{
  long lVar1;
  pointer pCVar2;
  reference pvVar3;
  PreselectedInput *this_00;
  Result<wallet::PreSelectedInputs> *this_01;
  T *pTVar4;
  mapped_type *pmVar5;
  NodeContext *wallet_name;
  CAmount *nTargetValue;
  CCoinControl *coin_control;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  check_type cVar6;
  undefined4 in_stack_fffffffffffffae4;
  int in_stack_fffffffffffffae8;
  char *local_508;
  char *local_500;
  assertion_result local_4f8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 local_4ba;
  undefined1 local_4b9;
  CAmount target;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  undefined1 local_498 [16];
  __uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> local_488;
  __uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> local_480;
  __uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> _Stack_478;
  __uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_470;
  __uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_> local_468;
  __uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_> local_460;
  __uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_> local_458;
  int local_450;
  undefined3 uStack_44c;
  _Optional_payload_base<int> local_448;
  Result<wallet::SelectionResult> result;
  undefined1 local_3c8 [16];
  thread local_3b8;
  char **ppcStack_3b0;
  uint32_t local_3a8;
  undefined1 local_3a4 [12];
  T preset_inputs;
  COutput output;
  CCoinControl cc;
  FastRandomContext rand;
  CoinsResult available_coins;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&cc,"",(allocator<char> *)&output);
  wallet_name = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                 super_ChainTestingSetup.super_BasicTestingSetup.m_node;
  NewWallet((NodeContext *)&wallet,(string *)wallet_name);
  std::__cxx11::string::~string((string *)&cc);
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  available_coins.total_amount = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>((string *)&cc,"dummy",(allocator<char> *)&rand)
  ;
  NewWallet((NodeContext *)&output,(string *)wallet_name);
  std::__cxx11::string::~string((string *)&cc);
  cc.destChange.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._0_8_ = 100000;
  cVar6 = CHECK_PRED;
  add_coin(&available_coins,
           (CWallet *)
           output.effective_value.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload,(CAmount *)&cc,(CFeeRate)0x0,0x90,false,0,
           false,in_stack_fffffffffffffae8);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)&output);
  target = 0x1863c;
  FastRandomContext::FastRandomContext(&rand,false);
  local_498._8_8_ = (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)0x9400000022;
  local_488._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
  super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
       (tuple<CConnman_*,_std::default_delete<CConnman>_>)
       (_Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>)0x3e8;
  local_470._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       (_Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)0x0;
  local_480._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)
       (_Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>)0x0;
  _Stack_478._M_t.
  super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
  super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
       (tuple<const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>)
       (_Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>)0x0;
  local_468._M_t.super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
  super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl =
       (tuple<PeerManager_*,_std::default_delete<PeerManager>_>)
       (_Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>)0xbb8;
  local_460._M_t.
  super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
  super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl =
       (tuple<ChainstateManager_*,_std::default_delete<ChainstateManager>_>)
       (_Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>)0x3e8;
  local_458._M_t.super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl =
       (tuple<BanMan_*,_std::default_delete<BanMan>_>)
       (_Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>)0x3e8;
  local_448._M_payload = (_Storage<int,_true>)0x0;
  local_448._M_engaged = false;
  local_448._5_3_ = 0;
  local_450 = 0;
  uStack_44c._0_1_ = false;
  uStack_44c._1_1_ = false;
  uStack_44c._2_1_ = false;
  local_498._0_8_ = &rand;
  CCoinControl::CCoinControl(&cc);
  cc.m_allow_other_inputs = false;
  CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result,
                   &available_coins);
  pvVar3 = std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::at
                     ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result,0);
  COutput::COutput(&output,pvVar3);
  std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
            ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result);
  CCoinControl::SetInputWeight(&cc,&output.outpoint,0x94);
  this_00 = CCoinControl::Select(&cc,&output.outpoint);
  PreselectedInput::SetTxOut(this_00,&output.txout);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock24,
             (AnnotatedMixin<std::recursive_mutex> *)
             ((long)wallet._M_t.
                    super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                    .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x1e8),
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
             ,0x60b,false);
  FetchSelectedInputs((Result<wallet::PreSelectedInputs> *)&result,
                      (CWallet *)
                      wallet._M_t.
                      super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                      .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,&cc,
                      (CoinSelectionParams *)local_498);
  this_01 = inline_assertion_check<true,util::Result<wallet::PreSelectedInputs>>
                      ((Result<wallet::PreSelectedInputs> *)&result,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
                       ,0x60c,"test_method","FetchSelectedInputs(*wallet, cc, cs_params)");
  pTVar4 = util::Result<wallet::PreSelectedInputs>::value(this_01);
  PreSelectedInputs::PreSelectedInputs(&preset_inputs,pTVar4);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::PreSelectedInputs>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::PreSelectedInputs> *)&result);
  local_508 = (char *)CONCAT44(local_508._4_4_,2);
  pmVar5 = std::
           map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
           ::operator[](&available_coins.coins,(key_type *)&local_508);
  pCVar2 = (pmVar5->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_3a8 = (pCVar2->outpoint).n;
  local_3c8._0_8_ = *(undefined8 *)&(pCVar2->outpoint).hash.m_wrapped.super_base_blob<256U>;
  local_3c8._8_8_ = *(undefined8 *)((long)&(pCVar2->outpoint).hash.m_wrapped + 8);
  local_3b8._M_id._M_thread = *(id *)((long)&(pCVar2->outpoint).hash.m_wrapped + 0x10);
  ppcStack_3b0 = *(char ***)((long)&(pCVar2->outpoint).hash.m_wrapped + 0x18);
  SaltedOutpointHasher::SaltedOutpointHasher((SaltedOutpointHasher *)&local_4f8,false);
  std::
  _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<COutPoint_const*>
            ((_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&result,local_3c8,local_3a4,0,&local_4f8,&local_4b9,&local_4ba);
  CoinsResult::Erase(&available_coins,
                     (unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                      *)&result);
  std::
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&result);
  nTargetValue = &target;
  coin_control = &cc;
  SelectCoins(&result,(CWallet *)
                      wallet._M_t.
                      super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                      .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,&available_coins
              ,&preset_inputs,nTargetValue,coin_control,(CoinSelectionParams *)local_498);
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = (iterator)coin_control;
  msg.m_begin = (iterator)nTargetValue;
  file.m_end = (iterator)0x610;
  file.m_begin = (iterator)&local_4d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_4e0,msg);
  local_4f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (result.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index != '\x01');
  local_4f8.m_message.px = (element_type *)0x0;
  local_4f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_508 = "!result";
  local_500 = "";
  local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
  local_3c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_3b8._M_id._M_thread = (id)boost::unit_test::lazy_ostream::inst;
  ppcStack_3b0 = &local_508;
  boost::test_tools::tt_detail::report_assertion
            (&local_4f8,(lazy_ostream *)local_3c8,1,0,WARN,CONCAT44(in_stack_fffffffffffffae4,cVar6)
             ,(size_t)&stack0xfffffffffffffae8,0x610);
  boost::detail::shared_count::~shared_count(&local_4f8.m_message.pn);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&preset_inputs);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock24.super_unique_lock);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&output.txout.scriptPubKey.super_CScriptBase);
  CCoinControl::~CCoinControl(&cc);
  ChaCha20::~ChaCha20(&rand.rng);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&available_coins);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(SelectCoins_effective_value_test)
{
    // Test that the effective value is used to check whether preset inputs provide sufficient funds when subtract_fee_outputs is not used.
    // This test creates a coin whose value is higher than the target but whose effective value is lower than the target.
    // The coin is selected using coin control, with m_allow_other_inputs = false. SelectCoins should fail due to insufficient funds.

    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;
    {
        std::unique_ptr<CWallet> dummyWallet = NewWallet(m_node, /*wallet_name=*/"dummy");
        add_coin(available_coins, *dummyWallet, 100000); // 0.001 BTC
    }

    CAmount target{99900}; // 0.000999 BTC

    FastRandomContext rand;
    CoinSelectionParams cs_params{
        rand,
        /*change_output_size=*/34,
        /*change_spend_size=*/148,
        /*min_change_target=*/1000,
        /*effective_feerate=*/CFeeRate(3000),
        /*long_term_feerate=*/CFeeRate(1000),
        /*discard_feerate=*/CFeeRate(1000),
        /*tx_noinputs_size=*/0,
        /*avoid_partial=*/false,
    };
    CCoinControl cc;
    cc.m_allow_other_inputs = false;
    COutput output = available_coins.All().at(0);
    cc.SetInputWeight(output.outpoint, 148);
    cc.Select(output.outpoint).SetTxOut(output.txout);

    LOCK(wallet->cs_wallet);
    const auto preset_inputs = *Assert(FetchSelectedInputs(*wallet, cc, cs_params));
    available_coins.Erase({available_coins.coins[OutputType::BECH32].begin()->outpoint});

    const auto result = SelectCoins(*wallet, available_coins, preset_inputs, target, cc, cs_params);
    BOOST_CHECK(!result);
}